

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O2

Matrix3d * ear::calcBasis(Matrix3d *__return_storage_ptr__,Vector3d *position)

{
  double dVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double norm;
  double local_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  double local_98;
  undefined1 local_88 [16];
  Vector3d local_78;
  Vector3d local_58;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_38;
  
  local_b8 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_c8 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  dStack_c0 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  local_d0 = SQRT(local_b8 * local_b8 + dStack_c0 * dStack_c0 + local_c8 * local_c8);
  if (1e-10 <= local_d0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (&local_38,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_c8,&local_d0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_a8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_38);
  }
  else {
    local_a8 = 0;
    uStack_a4 = 0;
    uStack_a0 = 0;
    uStack_9c = 0x3ff00000;
    local_98 = 0.0;
  }
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = local_98;
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       = (double)CONCAT44(uStack_a4,local_a8);
  (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
       = (double)CONCAT44(uStack_9c,uStack_a0);
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_58.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar1 = azimuth(&local_58);
  local_88._8_4_ = extraout_XMM0_Dc;
  local_88._0_8_ = dVar1;
  local_88._12_4_ = extraout_XMM0_Dd;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar1 = elevation(&local_78);
  localCoordinateSystem
            (__return_storage_ptr__,(double)(~-(ulong)(89.99999 < ABS(dVar1)) & local_88._0_8_),
             dVar1);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d calcBasis(Eigen::Vector3d position) {
    position = safeNormPosition(position);
    double az = azimuth(position);
    double el = elevation(position);

    // points near the poles have indeterminate azimuth; assume 0
    if (std::abs(el) > (90.0 - 1e-5)) {
      az = 0.0;
    }
    return localCoordinateSystem(az, el);
  }